

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed-message.h
# Opt level: O0

bool rtosc::validate<0,int,char_const*>(char *arg)

{
  char c;
  bool bVar1;
  char *in_RDI;
  advance_size<int> size;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  undefined1 local_1;
  
  c = rtosc_type(in_RDI,in_stack_ffffffffffffffec);
  bVar1 = valid_char<int>(c);
  if (bVar1) {
    local_1 = validate<1,char_const*>
                        ((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool validate(const char *arg)
{
    advance_size<This> size;
    if(size && !valid_char<This>(rtosc_type(arg,i)))
        return false;
    else if(!size && !match_path<This>(size, arg))
        return false;
    else
        return validate<i+size.value,Rest...>(arg);
}